

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

bool __thiscall
ArgsManager::ReadConfigFiles(ArgsManager *this,string *error,bool ignore_invalid_keys)

{
  list<SectionInfo,_std::allocator<SectionInfo>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  string arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  mapped_type *vec;
  size_t skip;
  size_t skip_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  path *ppVar8;
  bool bVar9;
  uint uVar10;
  string *conf_file_name;
  pointer pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  anon_class_16_2_d914f46d add_includes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conf_file_names;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  string chain_id;
  ifstream stream;
  path conf_path;
  string chain_id_final;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa7c;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  undefined8 in_stack_fffffffffffffa90;
  anon_class_16_2_d914f46d local_558;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  path local_528;
  path local_500;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  code *local_4b8 [61];
  string local_2d0;
  path local_2b0 [13];
  undefined1 local_a8 [8];
  bool local_a0;
  undefined7 uStack_9f;
  undefined1 local_80 [32];
  undefined1 local_60 [16];
  long local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = false;
  local_a8 = (undefined1  [8])this;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  ::clear(&(this->m_settings).ro_config._M_t);
  this_00 = &this->m_config_sections;
  std::__cxx11::_List_base<SectionInfo,_std::allocator<SectionInfo>_>::_M_clear
            (&this_00->super__List_base<SectionInfo,_std::allocator<SectionInfo>_>);
  (this->m_config_sections).super__List_base<SectionInfo,_std::allocator<SectionInfo>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->m_config_sections).super__List_base<SectionInfo,_std::allocator<SectionInfo>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->m_config_sections).super__List_base<SectionInfo,_std::allocator<SectionInfo>_>._M_impl.
  _M_node._M_size = 0;
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"-conf","");
  local_500._M_pathname._M_dataplus._M_p = "bitcoin.conf";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)(local_80 + 0x20),(char **)&local_500,auto_format);
  arg._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffa7c;
  arg._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa78;
  arg._M_string_length = (size_type)error;
  arg.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa88;
  arg.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa8c;
  arg.field_2._8_8_ = in_stack_fffffffffffffa90;
  GetPathArg((path *)local_4d8,this,arg,(path *)local_80);
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  AbsPathForConfigVal((path *)local_2b0,this,(path *)local_4d8,false);
  std::optional<fs::path>::operator=(&this->m_config_path,(path *)local_2b0);
  std::filesystem::__cxx11::path::~path(local_2b0);
  std::filesystem::__cxx11::path::~path((path *)local_4d8);
  std::filesystem::__cxx11::path::~path((path *)(local_80 + 0x20));
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_a8);
  GetConfigFilePath((path *)local_a8,this);
  std::ifstream::ifstream(local_2b0,(char *)local_a8,_S_in);
  local_4d8._0_8_ = (ArgsManager *)local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"-conf","");
  bVar5 = IsArgSet(this,(string *)local_4d8);
  if (bVar5) {
    iVar6 = *(int *)((long)&local_2b0[0]._M_cmpts._M_impl._M_t.
                            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            ._M_t +
                    *(long *)((long)local_2b0[0]._M_pathname._M_dataplus._M_p + -0x18));
    if ((ArgsManager *)local_4d8._0_8_ != (ArgsManager *)local_4c8) {
      operator_delete((void *)local_4d8._0_8_,(ulong)(local_4c8._0_8_ + 1));
    }
    if (iVar6 == 0) goto LAB_00d6906f;
    local_60._0_8_ = (long)local_60 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_80 + 0x20),local_a8,
               (pointer)((long)local_a8 + CONCAT71(uStack_9f,local_a0)));
    tinyformat::format<std::__cxx11::string>
              ((string *)local_4d8,(tinyformat *)"specified config file \"%s\" could not be opened."
               ,local_80 + 0x20,pbVar7);
    ReadConfigFiles();
  }
  else {
    if ((ArgsManager *)local_4d8._0_8_ != (ArgsManager *)local_4c8) {
      operator_delete((void *)local_4d8._0_8_,(ulong)(local_4c8._0_8_ + 1));
    }
LAB_00d6906f:
    if (*(int *)((long)&local_2b0[0]._M_cmpts._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t + *(long *)((long)local_2b0[0]._M_pathname._M_dataplus._M_p + -0x18))
        == 0) {
      local_4d8._0_8_ = (ArgsManager *)local_4c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4d8,local_a8,
                 (pointer)((long)local_a8 + CONCAT71(uStack_9f,local_a0)));
      uVar10 = (uint)ignore_invalid_keys;
      bVar5 = ReadConfigStream(this,(istream *)local_2b0,(string *)local_4d8,error,
                               ignore_invalid_keys);
      if ((ArgsManager *)local_4d8._0_8_ != (ArgsManager *)local_4c8) {
        operator_delete((void *)local_4d8._0_8_,(ulong)(local_4c8._0_8_ + 1));
      }
      if (!bVar5) goto LAB_00d6964a;
      local_4d8._8_8_ = local_4d8._8_8_ & 0xffffffffffffff00;
      local_4d8._0_8_ = this;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_4d8);
      vec = common::
            FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>&,char_const(&)[12]>
                      (&(this->m_settings).command_line_options,(char (*) [12])0xe82206);
      if (vec == (mapped_type *)0x0) {
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)local_4d8);
        GetChainTypeString_abi_cxx11_(&local_2d0,this);
        local_558.conf_file_names = &local_548;
        local_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_558.this = this;
        skip = ReadConfigFiles::anon_class_16_2_d914f46d::operator()(&local_558,&local_2d0,0);
        local_4d8._8_8_ = 0;
        local_4c8._0_8_ = local_4c8._0_8_ & 0xffffffffffffff00;
        local_4d8._0_8_ = (ArgsManager *)local_4c8;
        skip_00 = ReadConfigFiles::anon_class_16_2_d914f46d::operator()
                            (&local_558,(string *)local_4d8,0);
        if ((ArgsManager *)local_4d8._0_8_ != (ArgsManager *)local_4c8) {
          operator_delete((void *)local_4d8._0_8_,(ulong)(local_4c8._0_8_ + 1));
        }
        pbVar4 = local_548.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = local_548.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_548.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        if (!bVar5) {
          ppVar8 = (path *)(local_80 + 0x20);
          pbVar11 = local_548.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::filesystem::__cxx11::path::
            path<std::__cxx11::string,std::filesystem::__cxx11::path>(ppVar8,pbVar11,auto_format);
            std::filesystem::__cxx11::path::path(&local_528,ppVar8);
            std::filesystem::__cxx11::path::~path(ppVar8);
            AbsPathForConfigVal((path *)&local_500,this,(path *)&local_528,false);
            std::ifstream::ifstream
                      ((istream *)local_4d8,local_500._M_pathname._M_dataplus._M_p,_S_in);
            std::filesystem::__cxx11::path::~path(&local_500);
            std::filesystem::__cxx11::path::~path(&local_528);
            if (*(int *)((long)local_4b8 + (long)((FormatArg *)(local_4d8._0_8_ + -0x18))->m_value)
                != 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_80 + 0x20),"Failed to include configuration file ",pbVar11);
              ReadConfigFiles();
LAB_00d69612:
              std::ifstream::~ifstream(local_4d8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_548);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) goto LAB_00d69642;
              goto LAB_00d6964a;
            }
            bVar5 = ReadConfigStream(this,(istream *)local_4d8,pbVar11,error,SUB41(uVar10,0));
            if (!bVar5) goto LAB_00d69612;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/config.cpp"
            ;
            source_file._M_len = 0x5a;
            logging_function._M_str = "ReadConfigFiles";
            logging_function._M_len = 0xf;
            ::LogPrintf_<std::__cxx11::string>
                      (logging_function,source_file,0xb7,0x11508f2,(Level)pbVar11,(char *)error,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar10,in_stack_fffffffffffffa88));
            std::ifstream::~ifstream((istream *)local_4d8);
            pbVar11 = pbVar11 + 1;
            bVar5 = pbVar11 == pbVar4;
          } while (!bVar5);
        }
        pbVar11 = local_548.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = local_548.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_548.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_548.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar12 = &(local_548.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar12 + -1))->_M_dataplus)._M_p;
            if (paVar12 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar12->_M_allocated_capacity + 1);
            }
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (paVar12 + 1);
            paVar12 = paVar12 + 2;
          } while (pbVar7 != pbVar11);
          local_548.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        ReadConfigFiles::anon_class_16_2_d914f46d::operator()(&local_558,&local_2d0,skip);
        local_4d8._8_8_ = 0;
        local_4c8._0_8_ = local_4c8._0_8_ & 0xffffffffffffff00;
        local_4d8._0_8_ = (ArgsManager *)local_4c8;
        ReadConfigFiles::anon_class_16_2_d914f46d::operator()
                  (&local_558,(string *)local_4d8,skip_00);
        if ((ArgsManager *)local_4d8._0_8_ != (ArgsManager *)local_4c8) {
          operator_delete((void *)local_4d8._0_8_,(ulong)(local_4c8._0_8_ + 1));
        }
        GetChainTypeString_abi_cxx11_((string *)(local_80 + 0x20),this);
        if ((local_60._8_8_ != local_2d0._M_string_length) ||
           ((pbVar7 = local_548.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            pbVar3 = local_548.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish, local_60._8_8_ != 0 &&
            (iVar6 = bcmp((void *)local_60._0_8_,local_2d0._M_dataplus._M_p,local_60._8_8_),
            pbVar7 = local_548.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            pbVar3 = local_548.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish, iVar6 != 0)))) {
          ReadConfigFiles::anon_class_16_2_d914f46d::operator()
                    (&local_558,(string *)(local_80 + 0x20),0);
          pbVar7 = local_548.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar3 = local_548.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pbVar4 = local_548.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
            pbVar7 != local_548.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
          local_4d8._0_8_ = local_4c8;
          local_4d8._12_4_ = (undefined4)((ulong)local_4d8._8_8_ >> 0x20);
          local_4d8._8_4_ = 1;
          local_4c8._8_8_ = tinyformat::detail::FormatArg::formatImpl<std::__cxx11::string>;
          local_4b8[0] = tinyformat::detail::FormatArg::toIntImpl<std::__cxx11::string>;
          local_548.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
          local_4c8._0_8_ = pbVar7;
          tinyformat::detail::formatImpl
                    ((ostream *)&std::cerr,
                     "warning: -includeconf cannot be used from included files; ignoring -includeconf=%s\n"
                     ,(FormatArg *)local_4d8._0_8_,1);
          pbVar3 = local_548.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_548.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        local_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
        if (local_60._0_8_ != (long)local_60 + 0x10) {
          operator_delete((void *)local_60._0_8_,local_50 + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_548);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if (!bVar5) goto LAB_00d6964a;
      }
      else {
        common::SettingsSpan::SettingsSpan((SettingsSpan *)(local_80 + 0x20),vec);
        bVar5 = common::SettingsSpan::last_negated((SettingsSpan *)(local_80 + 0x20));
        if (!bVar5) {
          __assert_fail("common::SettingsSpan(*includes).last_negated()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/config.cpp"
                        ,0x96,"bool ArgsManager::ReadConfigFiles(std::string &, bool)");
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)local_4d8);
      }
    }
    ClearPathCache(this);
    bVar5 = CheckDataDirOption(this);
    bVar9 = true;
    if (bVar5) goto LAB_00d6964c;
    paVar1 = &local_500._M_pathname.field_2;
    local_500._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"-datadir","");
    paVar12 = &local_528._M_pathname.field_2;
    local_528._M_pathname._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"");
    ppVar8 = &local_528;
    GetArg((string *)(local_80 + 0x20),this,&local_500._M_pathname,&ppVar8->_M_pathname);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_4d8,(tinyformat *)"specified data directory \"%s\" does not exist.",
               local_80 + 0x20,&ppVar8->_M_pathname);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8)
    ;
    if ((ArgsManager *)local_4d8._0_8_ != (ArgsManager *)local_4c8) {
      operator_delete((void *)local_4d8._0_8_,(ulong)(local_4c8._0_8_ + 1));
    }
    if ((_Impl *)local_60._0_8_ != (_Impl *)(local_60 + 0x10)) {
      operator_delete((void *)local_60._0_8_,local_50 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_pathname._M_dataplus._M_p != paVar12) {
      operator_delete(local_528._M_pathname._M_dataplus._M_p,
                      local_528._M_pathname.field_2._M_allocated_capacity + 1);
    }
    local_2d0.field_2._M_allocated_capacity = local_500._M_pathname.field_2._M_allocated_capacity;
    local_2d0._M_dataplus._M_p = local_500._M_pathname._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_pathname._M_dataplus._M_p != paVar1) {
LAB_00d69642:
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00d6964a:
  bVar9 = false;
LAB_00d6964c:
  std::ifstream::~ifstream(local_2b0);
  std::filesystem::__cxx11::path::~path((path *)local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool ArgsManager::ReadConfigFiles(std::string& error, bool ignore_invalid_keys)
{
    {
        LOCK(cs_args);
        m_settings.ro_config.clear();
        m_config_sections.clear();
        m_config_path = AbsPathForConfigVal(*this, GetPathArg("-conf", BITCOIN_CONF_FILENAME), /*net_specific=*/false);
    }

    const auto conf_path{GetConfigFilePath()};
    std::ifstream stream{conf_path};

    // not ok to have a config file specified that cannot be opened
    if (IsArgSet("-conf") && !stream.good()) {
        error = strprintf("specified config file \"%s\" could not be opened.", fs::PathToString(conf_path));
        return false;
    }
    // ok to not have a config file
    if (stream.good()) {
        if (!ReadConfigStream(stream, fs::PathToString(conf_path), error, ignore_invalid_keys)) {
            return false;
        }
        // `-includeconf` cannot be included in the command line arguments except
        // as `-noincludeconf` (which indicates that no included conf file should be used).
        bool use_conf_file{true};
        {
            LOCK(cs_args);
            if (auto* includes = common::FindKey(m_settings.command_line_options, "includeconf")) {
                // ParseParameters() fails if a non-negated -includeconf is passed on the command-line
                assert(common::SettingsSpan(*includes).last_negated());
                use_conf_file = false;
            }
        }
        if (use_conf_file) {
            std::string chain_id = GetChainTypeString();
            std::vector<std::string> conf_file_names;

            auto add_includes = [&](const std::string& network, size_t skip = 0) {
                size_t num_values = 0;
                LOCK(cs_args);
                if (auto* section = common::FindKey(m_settings.ro_config, network)) {
                    if (auto* values = common::FindKey(*section, "includeconf")) {
                        for (size_t i = std::max(skip, common::SettingsSpan(*values).negated()); i < values->size(); ++i) {
                            conf_file_names.push_back((*values)[i].get_str());
                        }
                        num_values = values->size();
                    }
                }
                return num_values;
            };

            // We haven't set m_network yet (that happens in SelectParams()), so manually check
            // for network.includeconf args.
            const size_t chain_includes = add_includes(chain_id);
            const size_t default_includes = add_includes({});

            for (const std::string& conf_file_name : conf_file_names) {
                std::ifstream conf_file_stream{AbsPathForConfigVal(*this, fs::PathFromString(conf_file_name), /*net_specific=*/false)};
                if (conf_file_stream.good()) {
                    if (!ReadConfigStream(conf_file_stream, conf_file_name, error, ignore_invalid_keys)) {
                        return false;
                    }
                    LogPrintf("Included configuration file %s\n", conf_file_name);
                } else {
                    error = "Failed to include configuration file " + conf_file_name;
                    return false;
                }
            }

            // Warn about recursive -includeconf
            conf_file_names.clear();
            add_includes(chain_id, /* skip= */ chain_includes);
            add_includes({}, /* skip= */ default_includes);
            std::string chain_id_final = GetChainTypeString();
            if (chain_id_final != chain_id) {
                // Also warn about recursive includeconf for the chain that was specified in one of the includeconfs
                add_includes(chain_id_final);
            }
            for (const std::string& conf_file_name : conf_file_names) {
                tfm::format(std::cerr, "warning: -includeconf cannot be used from included files; ignoring -includeconf=%s\n", conf_file_name);
            }
        }
    }

    // If datadir is changed in .conf file:
    ClearPathCache();
    if (!CheckDataDirOption(*this)) {
        error = strprintf("specified data directory \"%s\" does not exist.", GetArg("-datadir", ""));
        return false;
    }
    return true;
}